

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_leave_cluster_req(raft_server *this,req_msg *req)

{
  int __fd;
  element_type *this_00;
  socklen_t *__addr_len;
  element_type *this_01;
  element_type *peVar1;
  msg_base *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<cornerstone::resp_msg> pVar3;
  ptr<resp_msg> pVar4;
  ptr<resp_msg> *resp;
  int *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  element_type *args;
  
  args = in_RDI;
  this_00 = std::
            __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d867b);
  srv_state::get_term(this_00);
  __addr_len = (socklen_t *)(in_RSI + 0xc);
  msg_base::get_src(in_RDX);
  pVar3 = cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                    ((unsigned_long *)args,(msg_type *)in_RDI,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90);
  _Var2 = pVar3.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
    *(undefined4 *)(in_RSI + 0x2c) = 2;
    this_01 = std::
              __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d86ee);
    peVar1 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d8704);
    __fd = (*peVar1->_vptr_log_store[2])();
    resp_msg::accept(this_01,__fd,__addr,__addr_len);
    _Var2._M_pi = extraout_RDX;
  }
  pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar4.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leave_cluster_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::leave_cluster_response, id_, req.get_src()));
    if (!config_changing_)
    {
        steps_to_down_ = 2;
        resp->accept(log_store_->next_slot());
    }

    return resp;
}